

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O1

void __thiscall
embree::avx::
HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
setExtentedRanges(HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
                  *this,PrimInfoExtRange *set,PrimInfoExtRange *lset,PrimInfoExtRange *rset,
                 size_t lweight,size_t rweight)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  
  uVar1 = (set->super_extended_range<unsigned_long>)._ext_end -
          (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  auVar3 = ZEXT416((uint)(((float)lweight / (float)(rweight + lweight)) * (float)uVar1));
  auVar3 = vroundss_avx(auVar3,auVar3,9);
  uVar2 = (ulong)auVar3._0_4_;
  uVar2 = (long)(auVar3._0_4_ - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2;
  if (uVar1 <= uVar2) {
    uVar2 = uVar1;
  }
  (lset->super_extended_range<unsigned_long>)._ext_end =
       (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end + uVar2;
  (rset->super_extended_range<unsigned_long>)._ext_end =
       (uVar1 + (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end) - uVar2
  ;
  return;
}

Assistant:

__noinline void setExtentedRanges(const PrimInfoExtRange& set, PrimInfoExtRange& lset, PrimInfoExtRange& rset, const size_t lweight, const size_t rweight)
        {
          assert(set.ext_range_size() > 0);
          const float left_factor           = (float)lweight / (lweight + rweight);
          const size_t ext_range_size       = set.ext_range_size();
          const size_t left_ext_range_size  = min((size_t)(floorf(left_factor * ext_range_size)),ext_range_size);
          const size_t right_ext_range_size = ext_range_size - left_ext_range_size;
          lset.set_ext_range(lset.end() + left_ext_range_size);
          rset.set_ext_range(rset.end() + right_ext_range_size);
        }